

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

deque<int,_std::allocator<int>_> * __thiscall
VertexClustering::sortNeighbor
          (VertexClustering *this,set<int,_std::less<int>,_std::allocator<int>_> *ring)

{
  bool bVar1;
  bool bVar2;
  long in_RSI;
  deque<int,_std::allocator<int>_> *in_RDI;
  int n;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  bool modified;
  int first;
  set<int,_std::less<int>,_std::allocator<int>_> unsorted;
  deque<int,_std::allocator<int>_> *q;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  _Self local_80;
  _Self local_78;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
  std::_Rb_tree_const_iterator<int>::operator*
            ((_Rb_tree_const_iterator<int> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (key_type *)in_stack_ffffffffffffff38);
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x2830c2);
  std::deque<int,_std::allocator<int>_>::push_back
            ((deque<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (value_type_conflict *)in_stack_ffffffffffffff38);
  do {
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2830e4);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = false;
    local_78._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
    local_80._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
    while (bVar2 = std::operator!=(&local_78,&local_80), bVar2) {
      std::_Rb_tree_const_iterator<int>::operator*
                ((_Rb_tree_const_iterator<int> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      std::deque<int,_std::allocator<int>_>::front
                ((deque<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff57 =
           Vertex::hasNeighborVertex
                     ((Vertex *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if ((bool)in_stack_ffffffffffffff57) {
        std::deque<int,_std::allocator<int>_>::push_front
                  ((deque<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (value_type_conflict *)in_stack_ffffffffffffff38);
        std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (key_type *)in_stack_ffffffffffffff38);
        bVar1 = true;
        break;
      }
      in_stack_ffffffffffffff38 = *(set<int,_std::less<int>,_std::allocator<int>_> **)(in_RSI + 8);
      std::deque<int,_std::allocator<int>_>::back
                ((deque<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      in_stack_ffffffffffffff47 =
           Vertex::hasNeighborVertex
                     ((Vertex *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      if ((bool)in_stack_ffffffffffffff47) {
        std::deque<int,_std::allocator<int>_>::push_back
                  ((deque<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (value_type_conflict *)in_stack_ffffffffffffff38);
        std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   (key_type *)in_stack_ffffffffffffff38);
        bVar1 = true;
        break;
      }
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)
                 CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    }
  } while (bVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x28329d);
  return in_RDI;
}

Assistant:

deque<int> VertexClustering::sortNeighbor(const set<int>& ring) {
	set<int> unsorted(ring);
	int first = *(unsorted.begin());
	unsorted.erase(first);
	deque<int> q;
	q.push_back(first);
	while (!unsorted.empty()) {
		bool modified = false;
		for (int n : unsorted) {
			if (vGroupNew->group[q.front()].hasNeighborVertex(n)) {
				q.push_front(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
			if (vGroupNew->group[q.back()].hasNeighborVertex(n)) {
				q.push_back(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
		}
		if (!modified)
			break;
	}
	return q;
}